

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_file.c
# Opt level: O2

int blank(FILE *f,char *name)

{
  uint uVar1;
  int iVar2;
  
  do {
    iVar2 = fgetc((FILE *)f);
    uVar1 = iVar2 + 1;
    if (0x21 < uVar1) goto LAB_00107399;
  } while ((0x200004c00U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
  if ((ulong)uVar1 == 0) {
    _p2sc_msg("blank",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
              ,0x171,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x10cc,
              "%s: unexpected end of file",name);
    exit(1);
  }
LAB_00107399:
  iVar2 = ungetc(iVar2,(FILE *)f);
  return iVar2;
}

Assistant:

static int blank(FILE *f, const char *name) {
    int c;

    do {
        c = fgetc(f);
        if (c == EOF) {
            P2SC_Msg(LVL_FATAL_CORRUPT_INPUT_DATA, "%s: unexpected end of file", name);
            return -1;
        }
    } while (c == ' ' || c == '\t' || c == '\n' || c == '\r');
    ungetc(c, f);

    return 0;
}